

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::changeColsIntegrality
          (Highs *this,HighsInt from_col,HighsInt to_col,HighsVarType *integrality)

{
  HighsInt HVar1;
  HighsStatus HVar2;
  HighsStatus HVar3;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  HighsStatus return_status;
  HighsStatus call_status;
  HighsInt create_error;
  HighsIndexCollection index_collection;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  HighsStatus in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  allocator local_111;
  string local_110 [16];
  string *in_stack_ffffffffffffff00;
  HighsStatus in_stack_ffffffffffffff08;
  HighsStatus in_stack_ffffffffffffff0c;
  Highs *in_stack_ffffffffffffff10;
  HighsVarType *in_stack_ffffffffffffff58;
  HighsIndexCollection *in_stack_ffffffffffffff60;
  Highs *in_stack_ffffffffffffff68;
  HighsIndexCollection local_70;
  uint local_18;
  uint local_14;
  HighsStatus local_4;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  clearPresolve((Highs *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  HighsIndexCollection::HighsIndexCollection
            ((HighsIndexCollection *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  HVar1 = create(&local_70,local_14,local_18,*(HighsInt *)(in_RDI + 0x138));
  if (HVar1 == 0) {
    HVar2 = changeIntegralityInterface
                      (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58
                      );
    HighsLogOptions::HighsLogOptions
              ((HighsLogOptions *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    in_stack_fffffffffffffec4 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"changeIntegrality",&local_111);
    HVar3 = interpretCallStatus((HighsLogOptions *)in_stack_ffffffffffffff10,
                                in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                                in_stack_ffffffffffffff00);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x492eb6);
    if (HVar3 == kError) {
      local_4 = kError;
    }
    else {
      local_4 = returnFromHighs(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    }
  }
  else {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                 "Interval [%d, %d] supplied to Highs::changeColsIntegrality is out of range [0, %d)\n"
                 ,(ulong)local_14,(ulong)local_18,(ulong)*(uint *)(in_RDI + 0x138));
    local_4 = kError;
    HVar2 = in_stack_fffffffffffffec0;
  }
  HighsIndexCollection::~HighsIndexCollection
            ((HighsIndexCollection *)CONCAT44(in_stack_fffffffffffffec4,HVar2));
  return local_4;
}

Assistant:

HighsStatus Highs::changeColsIntegrality(const HighsInt from_col,
                                         const HighsInt to_col,
                                         const HighsVarType* integrality) {
  clearPresolve();
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, from_col, to_col, model_.lp_.num_col_);
  if (create_error) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Interval [%d, %d] supplied to Highs::changeColsIntegrality "
                 "is out of range [0, %d)\n",
                 int(from_col), int(to_col), int(model_.lp_.num_col_));
    return HighsStatus::kError;
  }
  HighsStatus call_status =
      changeIntegralityInterface(index_collection, integrality);
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeIntegrality");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}